

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileDefinitionsCommand.cxx
# Opt level: O2

void __thiscall
cmTargetCompileDefinitionsCommand::HandleImportedTarget
          (cmTargetCompileDefinitionsCommand *this,string *tgt)

{
  cmMakefile *this_00;
  ostream *poVar1;
  string local_1b0;
  ostringstream e;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  poVar1 = std::operator<<((ostream *)&e,"Cannot specify compile definitions for imported target \""
                          );
  poVar1 = std::operator<<(poVar1,(string *)tgt);
  std::operator<<(poVar1,"\".");
  this_00 = (this->super_cmTargetPropCommandBase).super_cmCommand.Makefile;
  std::__cxx11::stringbuf::str();
  cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return;
}

Assistant:

void cmTargetCompileDefinitionsCommand
::HandleImportedTarget(const std::string &tgt)
{
  std::ostringstream e;
  e << "Cannot specify compile definitions for imported target \""
    << tgt << "\".";
  this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
}